

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

void __thiscall ncnn::Mat::to_pixels(Mat *this,uchar *pixels,int type,int stride)

{
  uint in_EDX;
  undefined8 in_RDI;
  uchar *unaff_retaddr;
  Mat *in_stack_00000008;
  int in_stack_0000017c;
  uchar *in_stack_00000180;
  undefined4 in_stack_00000188;
  int in_stack_0000018c;
  uchar *in_stack_00000190;
  Mat *in_stack_00000198;
  int in_stack_000001f4;
  uchar *in_stack_000001f8;
  Mat *in_stack_00000200;
  int stride_00;
  
  stride_00 = (int)((ulong)in_RDI >> 0x20);
  if ((in_EDX & 0xffff0000) == 0) {
    if ((in_EDX == 1) || (in_EDX == 2)) {
      to_rgb((Mat *)CONCAT44(in_stack_0000018c,in_stack_00000188),in_stack_00000180,
             in_stack_0000017c);
    }
    if (in_EDX == 3) {
      to_gray(in_stack_00000008,unaff_retaddr,stride_00);
    }
    if ((in_EDX != 4) && (in_EDX != 5)) {
      return;
    }
    to_rgba(in_stack_00000200,in_stack_000001f8,in_stack_000001f4);
    return;
  }
  if ((in_EDX == 0x10002) || (in_EDX == 0x20001)) {
    to_bgr2rgb(in_stack_00000198,in_stack_00000190,in_stack_0000018c);
    return;
  }
  if (in_EDX == 0x40001) {
LAB_00178974:
    to_rgb2rgba((Mat *)CONCAT44(in_stack_0000018c,in_stack_00000188),in_stack_00000180,
                in_stack_0000017c);
    return;
  }
  if (in_EDX == 0x40002) {
LAB_00178989:
    to_bgr2rgba((Mat *)CONCAT44(in_stack_0000018c,in_stack_00000188),in_stack_00000180,
                in_stack_0000017c);
  }
  else {
    if (in_EDX == 0x40003) {
LAB_0017899e:
      to_gray2rgba(in_stack_00000008,unaff_retaddr,stride_00);
      return;
    }
    if (in_EDX != 0x40005) {
      if (in_EDX == 0x50001) goto LAB_00178989;
      if (in_EDX == 0x50002) goto LAB_00178974;
      if (in_EDX == 0x50003) goto LAB_0017899e;
      if (in_EDX != 0x50004) {
        fprintf(_stderr,"unimplemented convert type %d",(ulong)in_EDX);
        fprintf(_stderr,"\n");
        return;
      }
    }
    to_rgba2bgra(in_stack_00000200,in_stack_000001f8,in_stack_000001f4);
  }
  return;
}

Assistant:

void Mat::to_pixels(unsigned char* pixels, int type, int stride) const
{
    if (type & PIXEL_CONVERT_MASK)
    {
        switch (type)
        {
        case PIXEL_RGB2BGR:
        case PIXEL_BGR2RGB:
            to_bgr2rgb(*this, pixels, stride);
            break;
        case PIXEL_RGB2RGBA:
        case PIXEL_BGR2BGRA:
            to_rgb2rgba(*this, pixels, stride);
            break;
        case PIXEL_BGR2RGBA:
        case PIXEL_RGB2BGRA:
            to_bgr2rgba(*this, pixels, stride);
            break;
        case PIXEL_GRAY2RGBA:
        case PIXEL_GRAY2BGRA:
            to_gray2rgba(*this, pixels, stride);
            break;
        case PIXEL_RGBA2BGRA:
        case PIXEL_BGRA2RGBA:
            to_rgba2bgra(*this, pixels, stride);
            break;
        default:
            // unimplemented convert type
            NCNN_LOGE("unimplemented convert type %d", type);
            break;
        }
    }
    else
    {
        if (type == PIXEL_RGB || type == PIXEL_BGR)
            to_rgb(*this, pixels, stride);

        if (type == PIXEL_GRAY)
            to_gray(*this, pixels, stride);

        if (type == PIXEL_RGBA || type == PIXEL_BGRA)
            to_rgba(*this, pixels, stride);
    }
}